

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35d0fd::StatTask::inputsAvailable(StatTask *this,TaskInterface ti)

{
  StatNode *this_00;
  BuildEngineDelegate *pBVar1;
  long lVar2;
  FileInfo *pFVar3;
  FileInfo *pFVar4;
  byte bVar5;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  FileInfo info;
  TaskInterface local_130;
  FileInfo local_120;
  FileInfo local_d0;
  BuildValue local_80;
  
  local_130.ctx = ti.ctx;
  local_130.impl = ti.impl;
  bVar5 = 0;
  this_00 = this->statnode;
  local_80.kind = (Kind)ti.impl;
  local_80.numOutputInfos = ti.impl._4_4_;
  local_80.signature.value._0_4_ = ti.ctx._0_4_;
  local_80.signature.value._4_4_ = ti.ctx._4_4_;
  pBVar1 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_80);
  llbuild::buildsystem::StatNode::getFileInfo
            (&local_d0,this_00,(FileSystem *)pBVar1[1]._vptr_BuildEngineDelegate[2]);
  if ((((local_d0.device == 0) && (local_d0.inode == 0)) && (local_d0.mode == 0)) &&
     (((local_d0.size == 0 && (local_d0.modTime.seconds == 0)) &&
      (local_d0.modTime.nanoseconds == 0)))) {
    local_80.kind = MissingInput;
    local_80.numOutputInfos = 0;
    local_80.signature.value._0_4_ = 0;
    local_80.signature.value._4_4_ = 0;
    local_80.valueData.asOutputInfo.device._0_4_ = 0;
    local_80.valueData._4_8_ = 0;
    local_80.valueData._12_8_ = 0;
    local_80.valueData._20_8_ = 0;
    local_80.valueData._28_8_ = 0;
    local_80.valueData._36_8_ = 0;
    local_80.valueData._44_8_ = 0;
    local_80.valueData._52_8_ = 0;
    local_80.valueData._60_8_ = 0;
    local_80.valueData._68_8_ = 0;
    local_80.valueData._76_4_ = 0;
    local_80.stringValues.contents._0_4_ = 0;
    local_80.stringValues.contents._4_4_ = 0;
    local_80.stringValues.size = 0;
    llbuild::buildsystem::BuildValue::toData((ValueType *)&local_120,&local_80);
    llbuild::core::TaskInterface::complete(&local_130,(ValueType *)&local_120,false);
  }
  else {
    pFVar3 = &local_d0;
    pFVar4 = &local_120;
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pFVar4->device = pFVar3->device;
      pFVar3 = (FileInfo *)((long)pFVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pFVar4 = (FileInfo *)((long)pFVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    if ((((void *)local_120.device == (void *)0x0) && (local_120.inode == 0)) &&
       ((local_120.mode == 0 &&
        (((local_120.size == 0 && (local_120.modTime.seconds == 0)) &&
         (local_120.modTime.nanoseconds == 0)))))) {
      __assert_fail("!outputInfo.isMissing()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                    ,0x113,
                    "static BuildValue llbuild::buildsystem::BuildValue::makeExistingInput(FileInfo)"
                   );
    }
    outputInfos.Length = 1;
    outputInfos.Data = &local_120;
    llbuild::buildsystem::BuildValue::BuildValue
              (&local_80,ExistingInput,outputInfos,(CommandSignature)0x0);
    llbuild::buildsystem::BuildValue::toData((ValueType *)&local_120,&local_80);
    llbuild::core::TaskInterface::complete(&local_130,(ValueType *)&local_120,false);
  }
  if ((void *)local_120.device != (void *)0x0) {
    operator_delete((void *)local_120.device,local_120.mode - local_120.device);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // FIXME: We should do this work in the background.

    // Get the information on the file.
    auto info = statnode.getFileInfo(getBuildSystem(ti).getFileSystem());
    if (info.isMissing()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    ti.complete(BuildValue::makeExistingInput(info).toData());
  }